

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void anon_unknown.dwarf_7001::setNonBlocking(TSocketDescriptor *sock)

{
  int iVar1;
  int *in_RDI;
  int result;
  int flag;
  int flags;
  undefined4 local_10;
  uint local_c;
  int *local_8;
  
  local_8 = in_RDI;
  local_c = fcntl(*in_RDI,3,0);
  fcntl(*local_8,4,(ulong)(local_c | 0x800));
  local_10 = 1;
  iVar1 = setsockopt(*local_8,6,1,&local_10,4);
  if (iVar1 != 0) {
    fprintf(_stderr,"Failed to set non-blocking socket\n");
  }
  return;
}

Assistant:

void setNonBlocking(TSocketDescriptor & sock) {
#ifdef _WIN32
        unsigned long nonblocking = 1;
        ioctlsocket(sock, FIONBIO, &nonblocking);
#else
        int flags;
        flags = fcntl(sock, F_GETFL, 0);
        fcntl(sock, F_SETFL, flags | O_NONBLOCK);

        int flag = 1;
        int result = setsockopt(sock,            /* socket affected */
                                IPPROTO_TCP,     /* set option at TCP level */
                                TCP_NODELAY,     /* name of option */
                                (char *) &flag,  /* the cast is historical cruft */
                                sizeof(int));    /* length of option value */
        if (result != 0) {
            fprintf(stderr, "Failed to set non-blocking socket\n");
        }
#endif
    }